

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O3

void __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::FreeAllocations(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
                  *this,bool release)

{
  bool bVar1;
  undefined7 in_register_00000031;
  TEmitBufferAllocation *allocation;
  
  if ((int)CONCAT71(in_register_00000031,release) == 0) {
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015b3868,EmitterPhase);
    if (bVar1) {
      DumpAndResetStats(this,DAT_01599230);
    }
  }
  allocation = this->allocations;
  if (allocation != (TEmitBufferAllocation *)0x0) {
    do {
      if (DAT_015933ac == '\x01') {
        CheckBufferPermissions(this,allocation);
      }
      if (release) {
        Memory::CustomHeap::
        Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::Free
                  (&this->allocationHeap,allocation->allocation);
      }
      else if ((this->scriptContext != (ScriptContext *)0x0) && (allocation->recorded == true)) {
        ThreadContext::SubCodeSize(this->scriptContext->threadContext,allocation->bytesCommitted);
        allocation->recorded = false;
      }
      allocation = allocation->nextAllocation;
    } while (allocation !=
             (EmitBufferAllocation<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
              *)0x0);
  }
  if (release) {
    this->allocations = (TEmitBufferAllocation *)0x0;
    return;
  }
  Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  DecommitAll(&this->allocationHeap);
  return;
}

Assistant:

void
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::FreeAllocations(bool release)
{
#if PDATA_ENABLED && defined(_WIN32)
    DelayDeletingFunctionTable::Clear();
#endif

    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

#if DBG_DUMP
    if (!release && PHASE_STATS1(Js::EmitterPhase))
    {
        this->DumpAndResetStats(Js::Configuration::Global.flags.Filename);
    }
#endif

    TEmitBufferAllocation * allocation = this->allocations;
    while (allocation != nullptr)
    {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if(CONFIG_FLAG(CheckEmitBufferPermissions))
        {
            CheckBufferPermissions(allocation);
        }
#endif
        if (release)
        {
            this->allocationHeap.Free(allocation->allocation);
        }
        else if ((scriptContext != nullptr) && allocation->recorded)
        {
            // In case of ThunkEmitter the script context would be null and we don't want to track that as code size.
            this->scriptContext->GetThreadContext()->SubCodeSize(allocation->bytesCommitted);
            allocation->recorded = false;
        }

        allocation = allocation->nextAllocation;
    }
    if (release)
    {
        this->allocations = nullptr;
    }
    else
    {
        this->allocationHeap.DecommitAll();
    }
}